

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string.cpp
# Opt level: O0

string * __thiscall
spvtools::to_string_abi_cxx11_(string *__return_storage_ptr__,spvtools *this,uint32_t n)

{
  int iVar1;
  long lVar2;
  allocator local_2d;
  uint local_2c;
  int local_28;
  int units;
  int write_index;
  char buf [10];
  int max_digits;
  uint32_t n_local;
  
  buf._6_4_ = SUB84(this,0);
  buf[2] = '\n';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  local_28 = 9;
  if (buf._6_4_ == 0) {
    buf[1] = '0';
  }
  else {
    for (; buf._6_4_ != 0; buf._6_4_ = (buf._6_4_ - local_2c) / 10) {
      local_2c = (uint)buf._6_4_ % 10;
      *(char *)((long)&units + (long)local_28 + 2) = ".0123456789"[(long)(int)local_2c + 1];
      local_28 = local_28 + -1;
    }
    local_28 = local_28 + 1;
  }
  if (local_28 < 0) {
    __assert_fail("write_index >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/to_string.cpp"
                  ,0x29,"std::string spvtools::to_string(uint32_t)");
  }
  lVar2 = (long)local_28;
  iVar1 = 10 - local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)((long)&units + lVar2 + 2),(long)iVar1,
             &local_2d);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(uint32_t n) {
  // This implementation avoids using standard library features that access
  // the locale.  Using the locale requires taking a mutex which causes
  // annoying serialization.

  constexpr int max_digits = 10;  // max uint has 10 digits
  // Contains the resulting digits, with least significant digit in the last
  // entry.
  char buf[max_digits];
  int write_index = max_digits - 1;
  if (n == 0) {
    buf[write_index] = '0';
  } else {
    while (n > 0) {
      int units = n % 10;
      buf[write_index--] = "0123456789"[units];
      n = (n - units) / 10;
    }
    write_index++;
  }
  assert(write_index >= 0);
  return std::string(buf + write_index, max_digits - write_index);
}